

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

PLYElement * __thiscall gvr::PLYReader::findElement(PLYReader *this,string *name)

{
  pointer ppPVar1;
  int iVar2;
  PLYElement *pPVar3;
  size_t i;
  ulong uVar4;
  
  pPVar3 = (PLYElement *)0x0;
  uVar4 = 0;
  while ((ppPVar1 = (this->list).
                    super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
         uVar4 < (ulong)((long)(this->list).
                               super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) &&
         (pPVar3 == (PLYElement *)0x0))) {
    iVar2 = std::__cxx11::string::compare((string *)ppPVar1[uVar4]);
    if (iVar2 == 0) {
      pPVar3 = (this->list).
               super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
    }
    else {
      pPVar3 = (PLYElement *)0x0;
    }
    uVar4 = uVar4 + 1;
  }
  return pPVar3;
}

Assistant:

PLYElement *PLYReader::findElement(const std::string &name) const
{
  PLYElement *ret=0;

  for (size_t i=0; i<list.size() && ret == 0; i++)
  {
    if (list[i]->getName().compare(name) == 0)
    {
      ret=list[i];
    }
  }

  return ret;
}